

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O2

void __thiscall NULLC::TraceContext::TraceContext(TraceContext *this)

{
  OutputContext::OutputContext(&this->output);
  TraceArray<NULLC::TraceScopeToken>::TraceArray(&this->scopeTokens,0x400);
  TraceArray<char>::TraceArray(&this->labels,0x2000);
  TraceArray<NULLC::TraceEvent>::TraceArray(&this->events,0x2000);
  this->outputEnabled = false;
  this->needComma = false;
  this->openEvent = false;
  this->depth = 0;
  this->outputDepth = 0;
  (this->outputBuf).count = 0;
  (this->outputBuf).max = 0;
  (this->outputBuf).data = (char *)0x0;
  (this->tempBuf).count = 0;
  (this->tempBuf).max = 0;
  (this->tempBuf).data = (char *)0x0;
  return;
}

Assistant:

TraceContext(): scopeTokens(1024), labels(8192), events(8192), outputBuf(0), tempBuf(0)
		{
			outputEnabled = false;

			needComma = false;
			openEvent = false;
			depth = 0;
			outputDepth = 0;
		}